

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O3

int decode_hex(BIGNUM *bn,char *in,int in_len)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  uint8_t hex;
  byte local_41;
  BIGNUM *local_40;
  char *local_38;
  
  local_38 = in;
  if (in_len < 0x20000000) {
    iVar1 = bn_expand(bn,(long)(in_len * 4));
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      if (in_len < 1) {
        lVar4 = 0;
      }
      else {
        lVar4 = 0;
        local_40 = bn;
        do {
          uVar2 = 0x10;
          if ((uint)in_len < 0x10) {
            uVar2 = (ulong)(uint)in_len;
          }
          lVar3 = uVar2 + 1;
          pcVar5 = local_38 + ((uint)in_len - uVar2);
          uVar2 = 0;
          do {
            local_41 = 0;
            iVar1 = OPENSSL_fromxdigit(&local_41,(int)*pcVar5);
            if (iVar1 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/convert.cc"
                            ,99,"int decode_hex(BIGNUM *, const char *, int)");
            }
            uVar2 = (ulong)local_41 | uVar2 << 4;
            lVar3 = lVar3 + -1;
            pcVar5 = pcVar5 + 1;
          } while (1 < lVar3);
          local_40->d[lVar4] = uVar2;
          lVar4 = lVar4 + 1;
          bVar6 = 0xf < (uint)in_len;
          in_len = in_len - 0x10;
          bVar7 = in_len != 0;
          if (!bVar6) {
            in_len = 0;
          }
          bn = local_40;
        } while (bVar6 && bVar7);
      }
      if (bn->dmax < (int)lVar4) {
        __assert_fail("i <= bn->dmax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/convert.cc"
                      ,0x6b,"int decode_hex(BIGNUM *, const char *, int)");
      }
      bn->width = (int)lVar4;
      iVar1 = 1;
    }
  }
  else {
    iVar1 = 0;
    ERR_put_error(3,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/convert.cc"
                  ,0x4d);
  }
  return iVar1;
}

Assistant:

static int decode_hex(BIGNUM *bn, const char *in, int in_len) {
  if (in_len > INT_MAX / 4) {
    OPENSSL_PUT_ERROR(BN, BN_R_BIGNUM_TOO_LONG);
    return 0;
  }
  // |in_len| is the number of hex digits.
  if (!bn_expand(bn, in_len * 4)) {
    return 0;
  }

  int i = 0;
  while (in_len > 0) {
    // Decode one |BN_ULONG| at a time.
    int todo = BN_BYTES * 2;
    if (todo > in_len) {
      todo = in_len;
    }

    BN_ULONG word = 0;
    int j;
    for (j = todo; j > 0; j--) {
      uint8_t hex = 0;
      if (!OPENSSL_fromxdigit(&hex, in[in_len - j])) {
        // This shouldn't happen. The caller checks |OPENSSL_isxdigit|.
        assert(0);
      }
      word = (word << 4) | hex;
    }

    bn->d[i++] = word;
    in_len -= todo;
  }
  assert(i <= bn->dmax);
  bn->width = i;
  return 1;
}